

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::
DHMap<std::pair<unsigned_int,_Kernel::SymbolType>,_Shell::InductionTemplate,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::pair<unsigned_int,_Kernel::SymbolType>,_Shell::InductionTemplate,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,pair<unsigned_int,_Kernel::SymbolType> *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  SymbolType SVar4;
  Entry *pEVar5;
  uint uVar6;
  Entry *pEVar7;
  ulong uVar8;
  uint uVar9;
  Entry *pEVar10;
  
  if (this->_capacity == 0) {
    pEVar10 = (Entry *)0x0;
  }
  else {
    uVar6 = DefaultHash::hash<unsigned_int,Kernel::SymbolType>(key);
    uVar1 = this->_timestamp;
    uVar2 = this->_capacity;
    uVar8 = (ulong)uVar6 % (ulong)uVar2;
    pEVar5 = this->_entries;
    uVar6 = pEVar5[uVar8].field_0._infoData;
    pEVar10 = (Entry *)0x0;
    if (uVar6 >> 2 == uVar1) {
      pEVar7 = pEVar5 + uVar8;
      uVar3 = key->first;
      SVar4 = key->second;
      if (((pEVar7->_key).first == uVar3) && ((pEVar7->_key).second == SVar4)) {
        uVar6 = uVar6 & 1;
      }
      else {
        if ((uVar6 & 2) == 0) {
          return (Entry *)0x0;
        }
        uVar6 = (SVar4 + (uVar3 >> 2) + uVar3 * 0x40 + 0x9e3779b9 ^ uVar3) % uVar2;
        do {
          uVar8 = (ulong)((int)uVar8 + uVar6 + (uVar6 == 0)) % (ulong)uVar2;
          pEVar7 = pEVar5 + uVar8;
          uVar9 = (uint)pEVar5[uVar8].field_0._infoData >> 2;
          if (uVar9 != uVar1) break;
        } while (((pEVar7->_key).first != uVar3) || ((pEVar7->_key).second != SVar4));
        uVar6 = pEVar5[uVar8].field_0._infoData & 1U | uVar9 ^ uVar1;
      }
      pEVar10 = (Entry *)0x0;
      if (uVar6 == 0) {
        pEVar10 = pEVar7;
      }
    }
  }
  return pEVar10;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }